

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O1

bool __thiscall ON_Brep::Write(ON_Brep *this,ON_BinaryArchive *file)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  shared_ptr<const_ON_Mesh> *psVar6;
  long lVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  element_type *peVar9;
  ulong uVar10;
  bool bVar11;
  
  iVar5 = ON_BinaryArchive::Archive3dmVersion(file);
  bVar3 = ON_BinaryArchive::Write3dmChunkVersion(file,3,iVar5 < 0x33 ^ 3);
  if (bVar3) {
    bVar3 = ON_CurveArray::Write(&this->m_C2,file);
  }
  if (bVar3 != false) {
    bVar3 = ON_CurveArray::Write(&this->m_C3,file);
  }
  if (bVar3 != false) {
    bVar3 = ON_SurfaceArray::Write(&this->m_S,file);
  }
  if (bVar3 != false) {
    bVar3 = ON_BrepVertexArray::Write(&this->m_V,file);
  }
  if (bVar3 != false) {
    bVar3 = ON_BrepEdgeArray::Write(&this->m_E,file);
  }
  if (bVar3 != false) {
    bVar3 = ON_BrepTrimArray::Write(&this->m_T,file);
  }
  if (bVar3 != false) {
    bVar3 = ON_BrepLoopArray::Write(&this->m_L,file);
  }
  if (bVar3 != false) {
    bVar3 = ON_BrepFaceArray::Write(&this->m_F,file);
  }
  if (bVar3 != false) {
    bVar3 = ON_BinaryArchive::WritePoint(file,&(this->m_bbox).m_min);
  }
  if (bVar3 != false) {
    bVar3 = ON_BinaryArchive::WritePoint(file,&(this->m_bbox).m_max);
  }
  if (bVar3 != false) {
    uVar1 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count;
    bVar3 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,0);
    bVar11 = bVar3;
    if (bVar3) {
      if (0 < (int)uVar1) {
        uVar10 = 1;
        lVar7 = 0;
        do {
          bVar3 = ON_BinaryArchive::Save3dmRenderMesh(file,brep_object);
          if (bVar3) {
            psVar6 = ON_BrepFace::SharedMesh
                               ((ON_BrepFace *)
                                ((((this->m_F).super_ON_ObjectArray<ON_BrepFace>.
                                   super_ON_ClassArray<ON_BrepFace>.m_a)->m_face_uuid).Data4 +
                                lVar7 + -0x5c),render_mesh);
            peVar9 = (psVar6->super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            p_Var8 = (psVar6->super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi;
            if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
              }
            }
          }
          else {
            peVar9 = (element_type *)0x0;
            p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          bVar3 = ON_BinaryArchive::WriteChar(file,peVar9 != (element_type *)0x0);
          if (bVar3 && peVar9 != (element_type *)0x0) {
            bVar3 = ON_BinaryArchive::WriteObject(file,(ON_Object *)peVar9);
          }
          if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
          }
          bVar11 = uVar10 < uVar1;
          lVar7 = lVar7 + 0xd8;
          uVar10 = uVar10 + 1;
        } while ((bVar3 & bVar11) != 0);
      }
      bVar4 = ON_BinaryArchive::EndWrite3dmChunk(file);
      bVar11 = false;
      if (bVar4) {
        bVar11 = bVar3;
      }
    }
    if (bVar11 != false) {
      bVar11 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,0);
    }
    bVar3 = bVar11;
    if (bVar11 != false) {
      if ((0 < (int)uVar1 & bVar11) == 1) {
        uVar10 = 1;
        lVar7 = 0;
        do {
          bVar3 = ON_BinaryArchive::Save3dmAnalysisMesh(file,brep_object);
          if (bVar3) {
            psVar6 = ON_BrepFace::SharedMesh
                               ((ON_BrepFace *)
                                ((((this->m_F).super_ON_ObjectArray<ON_BrepFace>.
                                   super_ON_ClassArray<ON_BrepFace>.m_a)->m_face_uuid).Data4 +
                                lVar7 + -0x5c),analysis_mesh);
            peVar9 = (psVar6->super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            p_Var8 = (psVar6->super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi;
            if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
              }
            }
          }
          else {
            peVar9 = (element_type *)0x0;
            p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          bVar11 = ON_BinaryArchive::WriteChar(file,peVar9 != (element_type *)0x0);
          if (bVar11 && peVar9 != (element_type *)0x0) {
            bVar11 = ON_BinaryArchive::WriteObject(file,(ON_Object *)peVar9);
          }
          if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
          }
          bVar3 = uVar10 < uVar1;
          lVar7 = lVar7 + 0xd8;
          uVar10 = uVar10 + 1;
        } while ((bVar11 & bVar3) != 0);
      }
      bVar4 = ON_BinaryArchive::EndWrite3dmChunk(file);
      bVar3 = false;
      if (bVar4) {
        bVar3 = bVar11;
      }
    }
  }
  bVar11 = bVar3;
  if (bVar3 != false) {
    bVar4 = ON_BinaryArchive::WriteInt(file,this->m_is_solid);
    bVar11 = false;
    if (bVar4) {
      bVar11 = bVar3;
    }
  }
  if (bVar11 != false) {
    if ((this->m_region_topology == (ON_BrepRegionTopology *)0x0) ||
       (iVar2 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                m_count, iVar2 == 0)) {
      bVar3 = false;
    }
    else {
      bVar3 = (this->m_region_topology->m_FS).super_ON_ObjectArray<ON_BrepFaceSide>.
              super_ON_ClassArray<ON_BrepFaceSide>.m_count == iVar2 * 2;
    }
    if (iVar5 < 0x33) {
      bVar4 = true;
      if ((bVar3 != false) && (iVar5 = ON_BinaryArchive::Archive3dmVersion(file), iVar5 == 0x32)) {
        Internal_AttachV5RegionTopologyAsUserData(this,file);
      }
    }
    else {
      bVar4 = ON_BinaryArchive::BeginWrite3dmAnonymousChunk(file,1);
      if (bVar4) {
        bVar11 = ON_BinaryArchive::WriteBool(file,bVar3);
        bVar4 = false;
        if (bVar11) {
          if ((bVar3 == false) ||
             (bVar3 = ON_BrepRegionTopology::Write(this->m_region_topology,file), bVar3)) {
            bVar4 = true;
          }
          else {
            bVar4 = false;
          }
        }
        bVar3 = ON_BinaryArchive::EndWrite3dmChunk(file);
        bVar11 = false;
        if (bVar3) {
          bVar11 = bVar4;
        }
        bVar4 = true;
      }
      else {
        bVar4 = false;
      }
    }
    if (!bVar4) {
      bVar11 = false;
    }
  }
  return bVar11;
}

Assistant:

bool ON_Brep::Write( ON_BinaryArchive& file ) const
{
  const ON_Brep* brep = this;
  ON_Brep* v2brep = 0;


  //bool rc = file.Write3dmChunkVersion(3,0); // serialization version
  //bool rc = file.Write3dmChunkVersion(3,1); // added meshes

  int minor_version 
    = (file.Archive3dmVersion() <= 50)
    ? 2
    : 3 // August 9, 2016 m_region_topology added to V6 files.
    ;

  bool rc = file.Write3dmChunkVersion(3,minor_version); // added m_is_solid

  // 2d curves
  if (rc) rc = brep->m_C2.Write(file);

  // 3d curves
  if (rc) rc = brep->m_C3.Write(file);

  // untrimmed surfaces
  if (rc) rc = brep->m_S.Write(file);

  // vertices
  if (rc) rc = brep->m_V.Write(file);

  // edges
  if (rc) rc = brep->m_E.Write(file);

  // trims
  if (rc) rc = brep->m_T.Write(file);

  // loops
  if (rc) rc = brep->m_L.Write(file);

  // faces
  if (rc) rc = brep->m_F.Write(file);

  // bounding box
  if (rc) rc = file.WritePoint( brep->m_bbox.m_min );
  if (rc) rc = file.WritePoint( brep->m_bbox.m_max );

  // end of chunk version 3.0

  if (rc)
  {
    // added for chunk version 3.1
    const int face_count = brep->m_F.Count();
    int fi;
    unsigned char b;

    // write render meshes
    rc = file.BeginWrite3dmChunk( TCODE_ANONYMOUS_CHUNK, 0 );
    if ( rc )
    {
      for ( fi = 0; rc && fi < face_count; fi++ ) {
        const auto mesh = file.Save3dmRenderMesh(ON::object_type::brep_object) ? brep->m_F[fi].SharedMesh(ON::render_mesh) : nullptr;
        b = mesh ? 1 : 0;
        rc = file.WriteChar(b);
        if (rc && mesh) {
          rc = file.WriteObject(*mesh);
        }
      }
      if ( !file.EndWrite3dmChunk() )
      {
        rc = false;
      }
    }

    // write analysis meshes
    if (rc) rc = file.BeginWrite3dmChunk( TCODE_ANONYMOUS_CHUNK, 0 );
    if ( rc )
    {
      for ( fi = 0; rc && fi < face_count; fi++ ) {
        const auto mesh = file.Save3dmAnalysisMesh(ON::object_type::brep_object) ? brep->m_F[fi].SharedMesh(ON::analysis_mesh) : nullptr;
        b = mesh ? 1 : 0;
        rc = file.WriteChar(b);
        if (rc && mesh) {
          rc = file.WriteObject(*mesh);
        }
      }
      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }

  }
  // end of chunk version 3.1

  if (rc)
  {
    // use value of "this" m_is_solid to avoid expensive 
    // calculation on the v2brep
    if ( !file.WriteInt( m_is_solid ) )
      rc = false;
  }

  // end of chunk version 3.2

  if (rc)
  {
    const bool bWriteRegionTopology
      = (nullptr != m_region_topology)
      && (m_F.UnsignedCount() > 0)
      && (m_region_topology->m_FS.UnsignedCount() == 2 * m_F.UnsignedCount());

    if (minor_version <= 2)
    {
      if (bWriteRegionTopology && minor_version == 2 && 50 == file.Archive3dmVersion())
        Internal_AttachV5RegionTopologyAsUserData(file);
    }
    else if (minor_version >= 3)
    {
      // begin chunk verson 3.3

      // region topology chunk added
      if (!file.BeginWrite3dmAnonymousChunk(1))
        return false;

      rc = false;
      for (;;)
      {
        if (!file.WriteBool(bWriteRegionTopology))
          break;
        if (bWriteRegionTopology)
        {
          if (!m_region_topology->Write(file))
            break;
        }
        rc = true;
        break;
      }
      if (!file.EndWrite3dmChunk())
        rc = false;
      // end chunk version 3.3
    }
  }

  if ( 0 != v2brep )
    delete v2brep;

  return rc;
}